

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

string * toml::internal::unescape(string *__return_storage_ptr__,string *codepoint)

{
  byte bVar1;
  uint8_t buf [8];
  allocator local_19d;
  uint32_t x;
  stringstream ss;
  uint auStack_180 [92];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)codepoint,_S_out|_S_in);
  *(uint *)((long)auStack_180 + *(long *)(_ss + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(_ss + -0x18)) & 0xffffffb5 | 8;
  std::istream::_M_extract<unsigned_int>((uint *)&ss);
  bVar1 = (byte)x;
  if (x < 0x80) {
    buf[1] = '\0';
    buf[0] = bVar1;
  }
  else if (x < 0x800) {
    buf[0] = (byte)(x >> 6) | 0xc0;
    buf[1] = bVar1 & 0x3f | 0x80;
    buf[2] = '\0';
  }
  else if (x < 0x10000) {
    buf[0] = (byte)(x >> 0xc) | 0xe0;
    buf[1] = (byte)(x >> 6) & 0x3f | 0x80;
    buf[2] = bVar1 & 0x3f | 0x80;
    buf[3] = '\0';
  }
  else if (x < 0x110000) {
    buf[0] = (byte)(x >> 0x12) | 0xf0;
    buf[1] = (byte)(x >> 0xc) & 0x3f | 0x80;
    buf[2] = (byte)(x >> 6) & 0x3f | 0x80;
    buf[3] = bVar1 & 0x3f | 0x80;
    buf[4] = '\0';
  }
  else {
    buf[0] = '\0';
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)buf,&local_19d);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

inline std::string unescape(const std::string& codepoint)
{
    std::uint32_t x;
    std::uint8_t buf[8];
    std::stringstream ss(codepoint);

    ss >> std::hex >> x;

    if (x <= 0x7FUL) {
        // 0xxxxxxx
        buf[0] = 0x00 | ((x >> 0) & 0x7F);
        buf[1] = '\0';
    } else if (x <= 0x7FFUL) {
        // 110yyyyx 10xxxxxx
        buf[0] = 0xC0 | ((x >> 6) & 0xDF);
        buf[1] = 0x80 | ((x >> 0) & 0xBF);
        buf[2] = '\0';
    } else if (x <= 0xFFFFUL) {
        // 1110yyyy 10yxxxxx 10xxxxxx
        buf[0] = 0xE0 | ((x >> 12) & 0xEF);
        buf[1] = 0x80 | ((x >> 6) & 0xBF);
        buf[2] = 0x80 | ((x >> 0) & 0xBF);
        buf[3] = '\0';
    } else if (x <= 0x10FFFFUL) {
        // 11110yyy 10yyxxxx 10xxxxxx 10xxxxxx
        buf[0] = 0xF0 | ((x >> 18) & 0xF7);
        buf[1] = 0x80 | ((x >> 12) & 0xBF);
        buf[2] = 0x80 | ((x >> 6) & 0xBF);
        buf[3] = 0x80 | ((x >> 0) & 0xBF);
        buf[4] = '\0';
    } else {
        buf[0] = '\0';
    }

    return reinterpret_cast<char*>(buf);
}